

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_internal_sha256_process(mbedtls_sha256_context_conflict *ctx,uchar *data)

{
  uint32_t uVar1;
  int iVar2;
  uint local_144;
  uint32_t local_140;
  uint i;
  anon_struct_296_4_ace97671 local;
  uchar *data_local;
  mbedtls_sha256_context_conflict *ctx_local;
  
  local.A._24_8_ = data;
  for (local_144 = 0; local_144 < 8; local_144 = local_144 + 1) {
    local.A[(ulong)local_144 - 2] = ctx->state[local_144];
  }
  for (local_144 = 0; local_144 < 0x40; local_144 = local_144 + 1) {
    if (local_144 < 0x10) {
      uVar1 = mbedtls_get_unaligned_uint32((void *)(local.A._24_8_ + (ulong)(local_144 << 2)));
      local.W[(ulong)local_144 - 2] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    else {
      local.W[(ulong)local_144 - 2] =
           ((local.W[(ulong)(local_144 - 2) - 2] >> 0x11 |
            local.W[(ulong)(local_144 - 2) - 2] << 0xf) ^
            (local.W[(ulong)(local_144 - 2) - 2] >> 0x13 |
            local.W[(ulong)(local_144 - 2) - 2] << 0xd) ^ local.W[(ulong)(local_144 - 2) - 2] >> 10)
           + local.W[(ulong)(local_144 - 7) - 2] +
           ((local.W[(ulong)(local_144 - 0xf) - 2] >> 7 |
            local.W[(ulong)(local_144 - 0xf) - 2] << 0x19) ^
            (local.W[(ulong)(local_144 - 0xf) - 2] >> 0x12 |
            local.W[(ulong)(local_144 - 0xf) - 2] << 0xe) ^
           local.W[(ulong)(local_144 - 0xf) - 2] >> 3) + local.W[(ulong)(local_144 - 0x10) - 2];
    }
    iVar2 = local.A[5] +
            ((local.A[2] >> 6 | local.A[2] << 0x1a) ^ (local.A[2] >> 0xb | local.A[2] << 0x15) ^
            (local.A[2] >> 0x19 | local.A[2] << 7)) +
            (local.A[4] ^ local.A[2] & (local.A[3] ^ local.A[4])) + K[local_144] +
            local.W[(ulong)local_144 - 2];
    i = ((local.W[0x3e] >> 2 | local.W[0x3e] << 0x1e) ^
         (local.W[0x3e] >> 0xd | local.W[0x3e] << 0x13) ^
        (local.W[0x3e] >> 0x16 | local.W[0x3e] << 10)) +
        (local.W[0x3e] & local.W[0x3f] | local.A[0] & (local.W[0x3e] | local.W[0x3f]));
    local_140 = iVar2 + i;
    local.A[5] = local.A[4];
    local.A[4] = local.A[3];
    local.A[3] = local.A[2];
    local.A[2] = iVar2 + local.A[1];
    local.A[1] = local.A[0];
    local.A[0] = local.W[0x3f];
    local.W[0x3f] = local.W[0x3e];
    local.W[0x3e] = local_140;
  }
  for (local_144 = 0; local_144 < 8; local_144 = local_144 + 1) {
    ctx->state[local_144] = local.A[(ulong)local_144 - 2] + ctx->state[local_144];
  }
  mbedtls_platform_zeroize(&local_140,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}